

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.cpp
# Opt level: O0

int anon_unknown.dwarf_208b::CheckVUV
              (double *coarse_aperiodicity,int number_of_aperiodicities,double *tmp_aperiodicity)

{
  int local_2c;
  double dStack_28;
  int i;
  double tmp;
  double *tmp_aperiodicity_local;
  int number_of_aperiodicities_local;
  double *coarse_aperiodicity_local;
  
  dStack_28 = 0.0;
  for (local_2c = 0; local_2c < number_of_aperiodicities; local_2c = local_2c + 1) {
    dStack_28 = coarse_aperiodicity[local_2c] + dStack_28;
    tmp_aperiodicity[local_2c + 1] = coarse_aperiodicity[local_2c];
  }
  return (uint)(-0.5 < dStack_28 / (double)number_of_aperiodicities);
}

Assistant:

static int CheckVUV(const double *coarse_aperiodicity,
    int number_of_aperiodicities, double *tmp_aperiodicity) {
  double tmp = 0.0;
  for (int i = 0; i < number_of_aperiodicities; ++i) {
    tmp += coarse_aperiodicity[i];
    tmp_aperiodicity[i + 1] = coarse_aperiodicity[i];
  }
  tmp /= number_of_aperiodicities;

  return tmp > -0.5 ? 1 : 0;  // -0.5 is not optimized, but okay.
}